

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseQName(xmlParserCtxtPtr ctxt,xmlChar **prefix)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *tmp_1;
  xmlChar *tmp;
  xmlChar *p;
  xmlChar *l;
  xmlChar **prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  p = xmlParseNCName(ctxt);
  if (p == (xmlChar *)0x0) {
    if ((*ctxt->input->cur == ':') && (pxVar1 = xmlParseName(ctxt), pxVar1 != (xmlChar *)0x0)) {
      xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s\'\n",pxVar1,(xmlChar *)0x0,
               (xmlChar *)0x0);
      *prefix = (xmlChar *)0x0;
      return pxVar1;
    }
    return (xmlChar *)0x0;
  }
  if (*ctxt->input->cur == ':') {
    xmlNextChar(ctxt);
    pxVar1 = xmlParseNCName(ctxt);
    if (pxVar1 == (xmlChar *)0x0) {
      if (ctxt->instate == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s:\'\n",p,(xmlChar *)0x0,
               (xmlChar *)0x0);
      pxVar1 = xmlParseNmtoken(ctxt);
      if (pxVar1 == (xmlChar *)0x0) {
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        tmp_1 = xmlBuildQName("",p,(xmlChar *)0x0,0);
      }
      else {
        tmp_1 = xmlBuildQName(pxVar1,p,(xmlChar *)0x0,0);
        (*xmlFree)(pxVar1);
      }
      pxVar1 = xmlDictLookup(ctxt->dict,tmp_1,-1);
      if (tmp_1 != (xmlChar *)0x0) {
        (*xmlFree)(tmp_1);
      }
      *prefix = (xmlChar *)0x0;
      return pxVar1;
    }
    if (*ctxt->input->cur == ':') {
      xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s:%s:\'\n",p,pxVar1,(xmlChar *)0x0);
      xmlNextChar(ctxt);
      pxVar2 = xmlParseName(ctxt);
      if (pxVar2 != (xmlChar *)0x0) {
        pxVar1 = xmlBuildQName(pxVar2,pxVar1,(xmlChar *)0x0,0);
        pxVar2 = xmlDictLookup(ctxt->dict,pxVar1,-1);
        if (pxVar1 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar1);
        }
        *prefix = p;
        return pxVar2;
      }
      if (ctxt->instate == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      pxVar1 = xmlBuildQName("",pxVar1,(xmlChar *)0x0,0);
      pxVar2 = xmlDictLookup(ctxt->dict,pxVar1,-1);
      if (pxVar1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar1);
      }
      *prefix = p;
      return pxVar2;
    }
    *prefix = p;
    p = pxVar1;
  }
  else {
    *prefix = (xmlChar *)0x0;
  }
  return p;
}

Assistant:

static const xmlChar *
xmlParseQName(xmlParserCtxtPtr ctxt, const xmlChar **prefix) {
    const xmlChar *l, *p;

    GROW;

    l = xmlParseNCName(ctxt);
    if (l == NULL) {
        if (CUR == ':') {
	    l = xmlParseName(ctxt);
	    if (l != NULL) {
	        xmlNsErr(ctxt, XML_NS_ERR_QNAME,
		         "Failed to parse QName '%s'\n", l, NULL, NULL);
		*prefix = NULL;
		return(l);
	    }
	}
        return(NULL);
    }
    if (CUR == ':') {
        NEXT;
	p = l;
	l = xmlParseNCName(ctxt);
	if (l == NULL) {
	    xmlChar *tmp;

            if (ctxt->instate == XML_PARSER_EOF)
                return(NULL);
            xmlNsErr(ctxt, XML_NS_ERR_QNAME,
	             "Failed to parse QName '%s:'\n", p, NULL, NULL);
	    l = xmlParseNmtoken(ctxt);
	    if (l == NULL) {
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		tmp = xmlBuildQName(BAD_CAST "", p, NULL, 0);
            } else {
		tmp = xmlBuildQName(l, p, NULL, 0);
		xmlFree((char *)l);
	    }
	    p = xmlDictLookup(ctxt->dict, tmp, -1);
	    if (tmp != NULL) xmlFree(tmp);
	    *prefix = NULL;
	    return(p);
	}
	if (CUR == ':') {
	    xmlChar *tmp;

            xmlNsErr(ctxt, XML_NS_ERR_QNAME,
	             "Failed to parse QName '%s:%s:'\n", p, l, NULL);
	    NEXT;
	    tmp = (xmlChar *) xmlParseName(ctxt);
	    if (tmp != NULL) {
	        tmp = xmlBuildQName(tmp, l, NULL, 0);
		l = xmlDictLookup(ctxt->dict, tmp, -1);
		if (tmp != NULL) xmlFree(tmp);
		*prefix = p;
		return(l);
	    }
            if (ctxt->instate == XML_PARSER_EOF)
                return(NULL);
	    tmp = xmlBuildQName(BAD_CAST "", l, NULL, 0);
	    l = xmlDictLookup(ctxt->dict, tmp, -1);
	    if (tmp != NULL) xmlFree(tmp);
	    *prefix = p;
	    return(l);
	}
	*prefix = p;
    } else
        *prefix = NULL;
    return(l);
}